

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

mg_request_info * mg_get_request_info(mg_connection *conn)

{
  mg_connection *conn_local;
  
  if (conn == (mg_connection *)0x0) {
    conn_local = (mg_connection *)0x0;
  }
  else if (conn->connection_type == 1) {
    conn_local = (mg_connection *)&conn->request_info;
  }
  else {
    conn_local = (mg_connection *)0x0;
  }
  return (mg_request_info *)conn_local;
}

Assistant:

mg_request_info *
mg_get_request_info(const struct mg_connection *conn)
{
	if (!conn) {
		return NULL;
	}
#if defined(MG_ALLOW_USING_GET_REQUEST_INFO_FOR_RESPONSE)
	if (conn->connection_type == CONNECTION_TYPE_RESPONSE) {
		char txt[16];
		struct mg_workerTLS *tls =
		    (struct mg_workerTLS *)pthread_getspecific(sTlsKey);

		sprintf(txt, "%03i", conn->response_info.status_code);
		if (strlen(txt) == 3) {
			memcpy(tls->txtbuf, txt, 4);
		} else {
			strcpy(tls->txtbuf, "ERR");
		}

		((struct mg_connection *)conn)->request_info.local_uri =
		    tls->txtbuf; /* use thread safe buffer */
		((struct mg_connection *)conn)->request_info.local_uri_raw =
		    tls->txtbuf; /* use the same thread safe buffer */
		((struct mg_connection *)conn)->request_info.request_uri =
		    tls->txtbuf; /* use  the same thread safe buffer */

		((struct mg_connection *)conn)->request_info.num_headers =
		    conn->response_info.num_headers;
		memcpy(((struct mg_connection *)conn)->request_info.http_headers,
		       conn->response_info.http_headers,
		       sizeof(conn->response_info.http_headers));
	} else
#endif
	    if (conn->connection_type != CONNECTION_TYPE_REQUEST) {
		return NULL;
	}
	return &conn->request_info;
}